

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_decompressSequencesSplitLitBuffer
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ulong *puVar9;
  BYTE *pBVar10;
  BYTE *oend_1;
  BYTE *pBVar11;
  ulong uVar12;
  size_t unaff_RBP;
  BYTE *oend_2;
  BYTE *pBVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  BYTE *op;
  ulong uVar18;
  BYTE *oend;
  BYTE *pBVar19;
  ulong uVar20;
  bool bVar21;
  BYTE *litPtr;
  size_t local_110;
  size_t local_108;
  BYTE *local_f8;
  BYTE *local_f0;
  BIT_DStream_t local_e8;
  ZSTD_fseState local_c0;
  ZSTD_fseState local_b0;
  ZSTD_fseState local_a0;
  ulong local_90 [4];
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *local_38;
  
  if (dctx->bmi2 != 0) {
    sVar4 = ZSTD_decompressSequencesSplitLitBuffer_bmi2
                      (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar4;
  }
  sVar4 = 0;
  if (0 < (long)maxDstSize) {
    sVar4 = maxDstSize;
  }
  pBVar11 = (BYTE *)(sVar4 + (long)dst);
  local_f8 = dctx->litPtr;
  local_70 = dctx->litBufferEnd;
  op = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_01d9c6d0;
  local_58 = (BYTE *)dctx->prefixStart;
  local_60 = (BYTE *)dctx->virtualStart;
  local_68 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar5 = -0xc;
  do {
    *(ulong *)((long)local_90 + lVar5 * 2 + 0x18) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar5);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0);
  if (seqSize == 0) {
    local_e8.ptr = (char *)0x0;
    local_e8.start = (char *)0x0;
    local_e8.bitContainer = 0;
    local_e8.bitsConsumed = 0;
    local_e8._12_4_ = 0;
    local_e8.limitPtr = (char *)0x0;
LAB_01d9b64c:
    bVar21 = false;
    local_108 = 0xffffffffffffffec;
  }
  else {
    local_e8.limitPtr = (char *)((long)seqStart + 8);
    local_e8.start = (char *)seqStart;
    if (seqSize < 8) {
      local_e8.bitContainer = (BitContainerType)*seqStart;
      switch(seqSize) {
      case 7:
        local_e8.bitContainer = (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_e8.bitContainer
        ;
      case 6:
        local_e8.bitContainer =
             local_e8.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_e8.bitContainer =
             local_e8.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_e8.bitContainer =
             local_e8.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_e8.bitContainer =
             local_e8.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_e8.bitContainer = local_e8.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100
        ;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar17 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      local_e8.bitsConsumed = ~uVar17 + 9;
      if (bVar1 == 0) {
        local_e8.bitsConsumed = 0;
      }
      local_e8.ptr = (char *)seqStart;
      if (bVar1 == 0) goto LAB_01d9b64c;
      local_e8.bitsConsumed = local_e8.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_e8.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_e8.bitContainer = *(BitContainerType *)local_e8.ptr;
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar17 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      local_e8.bitsConsumed = ~uVar17 + 9;
      if (bVar1 == 0) {
        local_e8.bitsConsumed = 0;
      }
      if (bVar1 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_01d9b64c;
    }
    local_f0 = pBVar11;
    ZSTD_initFseState(&local_c0,&local_e8,dctx->LLTptr);
    ZSTD_initFseState(&local_b0,&local_e8,dctx->OFTptr);
    ZSTD_initFseState(&local_a0,&local_e8,dctx->MLTptr);
    do {
      pBVar11 = local_58;
      local_110 = (size_t)local_a0.table[local_a0.state].baseValue;
      uVar17 = local_c0.table[local_c0.state].baseValue;
      uVar18 = (ulong)uVar17;
      bVar1 = local_c0.table[local_c0.state].nbAdditionalBits;
      bVar7 = local_a0.table[local_a0.state].nbAdditionalBits;
      bVar2 = local_b0.table[local_b0.state].nbAdditionalBits;
      bVar6 = (byte)local_e8.bitsConsumed;
      if (bVar2 < 2) {
        if (bVar2 != 0) {
          local_e8.bitsConsumed = local_e8.bitsConsumed + 1;
          lVar5 = (ulong)(local_b0.table[local_b0.state].baseValue + (uint)(uVar17 == 0)) -
                  ((long)(local_e8.bitContainer << (bVar6 & 0x3f)) >> 0x3f);
          if (lVar5 == 3) {
            local_90[0] = local_90[0] - 1;
          }
          else {
            local_90[0] = local_90[lVar5];
          }
          uVar20 = -(ulong)(local_90[0] == 0) | local_90[0];
          if (lVar5 != 1) goto LAB_01d9b7e8;
          goto LAB_01d9b7f8;
        }
        uVar20 = local_90[uVar17 == 0];
        puVar9 = local_90 + (uVar17 != 0);
      }
      else {
        local_e8.bitsConsumed = local_e8.bitsConsumed + bVar2;
        uVar20 = ((local_e8.bitContainer << (bVar6 & 0x3f)) >> (-bVar2 & 0x3f)) +
                 (ulong)local_b0.table[local_b0.state].baseValue;
LAB_01d9b7e8:
        local_90[2] = local_90[1];
LAB_01d9b7f8:
        puVar9 = local_90;
      }
      local_90[1] = *puVar9;
      local_90[0] = uVar20;
      if (bVar7 != 0) {
        bVar6 = (byte)local_e8.bitsConsumed;
        local_e8.bitsConsumed = local_e8.bitsConsumed + bVar7;
        local_110 = local_110 + ((local_e8.bitContainer << (bVar6 & 0x3f)) >> (-bVar7 & 0x3f));
      }
      if (0x1e < (byte)(bVar7 + bVar1 + bVar2)) {
        if (local_e8.bitsConsumed < 0x41) {
          if (local_e8.ptr < local_e8.limitPtr) {
            if (local_e8.ptr == local_e8.start) goto LAB_01d9b872;
            uVar12 = (ulong)(uint)((int)local_e8.ptr - (int)local_e8.start);
            if (local_e8.start <=
                (ulong *)((long)local_e8.ptr - (ulong)(local_e8.bitsConsumed >> 3))) {
              uVar12 = (ulong)(local_e8.bitsConsumed >> 3);
            }
            uVar17 = local_e8.bitsConsumed + (int)uVar12 * -8;
          }
          else {
            uVar12 = (ulong)(local_e8.bitsConsumed >> 3);
            uVar17 = local_e8.bitsConsumed & 7;
          }
          local_e8.ptr = (char *)((long)local_e8.ptr - uVar12);
          local_e8.bitsConsumed = uVar17;
          local_e8.bitContainer = *(BitContainerType *)local_e8.ptr;
        }
        else {
          local_e8.ptr = "";
        }
      }
LAB_01d9b872:
      if (bVar1 != 0) {
        bVar7 = (byte)local_e8.bitsConsumed;
        local_e8.bitsConsumed = local_e8.bitsConsumed + bVar1;
        uVar18 = uVar18 + ((local_e8.bitContainer << (bVar7 & 0x3f)) >> (-bVar1 & 0x3f));
      }
      if (nbSeq != 1) {
        iVar15 = local_c0.table[local_c0.state].nbBits + local_e8.bitsConsumed;
        iVar16 = iVar15 + (uint)local_a0.table[local_a0.state].nbBits;
        local_c0.state =
             (~(-1L << (local_c0.table[local_c0.state].nbBits & 0x3f)) &
             local_e8.bitContainer >> (-(char)iVar15 & 0x3fU)) +
             (ulong)local_c0.table[local_c0.state].nextState;
        uVar17 = iVar16 + (uint)local_b0.table[local_b0.state].nbBits;
        local_a0.state =
             (~(-1L << (local_a0.table[local_a0.state].nbBits & 0x3f)) &
             local_e8.bitContainer >> (-(char)iVar16 & 0x3fU)) +
             (ulong)local_a0.table[local_a0.state].nextState;
        local_b0.state =
             (~(-1L << (local_b0.table[local_b0.state].nbBits & 0x3f)) &
             local_e8.bitContainer >> (-(char)uVar17 & 0x3fU)) +
             (ulong)local_b0.table[local_b0.state].nextState;
        local_e8.bitsConsumed = uVar17;
        if (uVar17 < 0x41) {
          if (local_e8.ptr < local_e8.limitPtr) {
            if (local_e8.ptr == local_e8.start) goto LAB_01d9b99b;
            uVar8 = (int)local_e8.ptr - (int)local_e8.start;
            if (local_e8.start <= (ulong *)((long)local_e8.ptr - (ulong)(uVar17 >> 3))) {
              uVar8 = uVar17 >> 3;
            }
            local_e8.bitsConsumed = uVar17 + uVar8 * -8;
          }
          else {
            uVar8 = uVar17 >> 3;
            local_e8.bitsConsumed = uVar17 & 7;
          }
          local_e8.ptr = (char *)((long)local_e8.ptr - (ulong)uVar8);
          local_e8.bitContainer = *(BitContainerType *)local_e8.ptr;
        }
        else {
          local_e8.ptr = "";
        }
      }
LAB_01d9b99b:
      pBVar10 = local_f8 + uVar18;
      iVar15 = nbSeq;
      if (dctx->litBufferEnd < pBVar10) break;
      if ((local_70 < pBVar10) || (uVar12 = uVar18 + local_110, pBVar10 + -0x20 < op + uVar12)) {
        sStack_48 = local_110;
        sequence.matchLength = local_110;
        sequence.litLength = uVar18;
        sequence.offset = uVar20;
        local_50 = uVar18;
        local_40 = uVar20;
        uVar12 = ZSTD_execSequenceEndSplitLitBuffer
                           (op,local_f0,pBVar10 + -0x20,sequence,&local_f8,local_70,local_58,
                            local_60,local_68);
      }
      else {
        pBVar19 = op + uVar18;
        uVar3 = *(undefined8 *)(local_f8 + 8);
        *(undefined8 *)op = *(undefined8 *)local_f8;
        *(undefined8 *)(op + 8) = uVar3;
        if (0x10 < uVar18) {
          uVar3 = *(undefined8 *)(local_f8 + 0x18);
          *(undefined8 *)(op + 0x10) = *(undefined8 *)(local_f8 + 0x10);
          *(undefined8 *)(op + 0x18) = uVar3;
          if (0x10 < (long)(uVar18 - 0x10)) {
            lVar5 = 0;
            do {
              uVar3 = *(undefined8 *)(local_f8 + lVar5 + 0x20 + 8);
              pBVar13 = op + lVar5 + 0x20;
              *(undefined8 *)pBVar13 = *(undefined8 *)(local_f8 + lVar5 + 0x20);
              *(undefined8 *)(pBVar13 + 8) = uVar3;
              uVar3 = *(undefined8 *)(local_f8 + lVar5 + 0x30 + 8);
              *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(local_f8 + lVar5 + 0x30);
              *(undefined8 *)(pBVar13 + 0x18) = uVar3;
              lVar5 = lVar5 + 0x20;
            } while (pBVar13 + 0x20 < pBVar19);
          }
        }
        pBVar13 = pBVar19 + -uVar20;
        uVar14 = local_110;
        local_f8 = pBVar10;
        if ((ulong)((long)pBVar19 - (long)local_58) < uVar20) {
          if ((ulong)((long)pBVar19 - (long)local_60) < uVar20) {
            uVar12 = 0xffffffffffffffec;
          }
          else {
            lVar5 = (long)pBVar13 - (long)local_58;
            pBVar10 = local_68 + lVar5;
            if (local_68 < pBVar10 + local_110) {
              memmove(pBVar19,pBVar10,-lVar5);
              pBVar19 = pBVar19 + -lVar5;
              uVar14 = lVar5 + local_110;
              pBVar13 = pBVar11;
              goto LAB_01d9ba75;
            }
            memmove(pBVar19,pBVar10,local_110);
          }
        }
        else {
LAB_01d9ba75:
          if (uVar20 < 0x10) {
            if (uVar20 < 8) {
              iVar15 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                ::dec64table + uVar20 * 4);
              *pBVar19 = *pBVar13;
              pBVar19[1] = pBVar13[1];
              pBVar19[2] = pBVar13[2];
              pBVar19[3] = pBVar13[3];
              pBVar11 = pBVar13 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec32table + uVar20 * 4);
              pBVar13 = pBVar13 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4) - (long)iVar15);
              *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)pBVar11;
            }
            else {
              *(undefined8 *)pBVar19 = *(undefined8 *)pBVar13;
            }
            if (8 < uVar14) {
              pBVar11 = pBVar13 + 8;
              pBVar10 = pBVar19 + 8;
              if ((long)pBVar10 - (long)pBVar11 < 0x10) {
                do {
                  *(undefined8 *)pBVar10 = *(undefined8 *)pBVar11;
                  pBVar10 = pBVar10 + 8;
                  pBVar11 = pBVar11 + 8;
                } while (pBVar10 < pBVar19 + uVar14);
              }
              else {
                uVar3 = *(undefined8 *)(pBVar13 + 0x10);
                *(undefined8 *)pBVar10 = *(undefined8 *)pBVar11;
                *(undefined8 *)(pBVar19 + 0x10) = uVar3;
                if (0x18 < (long)uVar14) {
                  lVar5 = 0;
                  do {
                    uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x18 + 8);
                    pBVar11 = pBVar19 + lVar5 + 0x18;
                    *(undefined8 *)pBVar11 = *(undefined8 *)(pBVar13 + lVar5 + 0x18);
                    *(undefined8 *)(pBVar11 + 8) = uVar3;
                    uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x28 + 8);
                    *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(pBVar13 + lVar5 + 0x28);
                    *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                    lVar5 = lVar5 + 0x20;
                  } while (pBVar11 + 0x20 < pBVar19 + uVar14);
                }
              }
            }
          }
          else {
            uVar3 = *(undefined8 *)(pBVar13 + 8);
            *(undefined8 *)pBVar19 = *(undefined8 *)pBVar13;
            *(undefined8 *)(pBVar19 + 8) = uVar3;
            if (0x10 < (long)uVar14) {
              lVar5 = 0x10;
              do {
                uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 8);
                pBVar11 = pBVar19 + lVar5;
                *(undefined8 *)pBVar11 = *(undefined8 *)(pBVar13 + lVar5);
                *(undefined8 *)(pBVar11 + 8) = uVar3;
                uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x10 + 8);
                *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(pBVar13 + lVar5 + 0x10);
                *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                lVar5 = lVar5 + 0x20;
              } while (pBVar11 + 0x20 < pBVar19 + uVar14);
            }
          }
        }
      }
      uVar14 = uVar12;
      if (0xffffffffffffff88 < uVar12) {
        local_108 = uVar12;
        uVar14 = 0;
      }
      op = op + uVar14;
      if (0xffffffffffffff88 < uVar12) {
        bVar21 = false;
        goto LAB_01d9bfc4;
      }
      nbSeq = nbSeq + -1;
      iVar15 = 0;
    } while (nbSeq != 0);
    nbSeq = iVar15;
    if (nbSeq < 1) {
      bVar21 = true;
    }
    else {
      uVar12 = (long)dctx->litBufferEnd - (long)local_f8;
      if (uVar12 != 0) {
        if ((ulong)((long)local_f0 - (long)op) < uVar12) {
          local_108 = 0xffffffffffffffba;
          bVar21 = false;
          goto LAB_01d9bfc4;
        }
        ZSTD_safecopyDstBeforeSrc(op,local_f8,uVar12);
        uVar18 = uVar18 - uVar12;
        op = op + uVar12;
      }
      pBVar11 = local_58;
      local_f8 = dctx->litExtraBuffer;
      local_70 = dctx->litExtraBuffer + 0x10000;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      if (((long)uVar18 < 0x10001) && (uVar12 = uVar18 + local_110, op + uVar12 <= local_f0 + -0x20)
         ) {
        pBVar10 = op + uVar18;
        pBVar19 = dctx->litExtraBuffer + uVar18;
        uVar3 = *(undefined8 *)(dctx->litExtraBuffer + 8);
        *(undefined8 *)op = *(undefined8 *)local_f8;
        *(undefined8 *)(op + 8) = uVar3;
        if (0x10 < uVar18) {
          uVar3 = *(undefined8 *)(dctx->litExtraBuffer + 0x18);
          *(undefined8 *)(op + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + 0x10);
          *(undefined8 *)(op + 0x18) = uVar3;
          if (0x10 < (long)(uVar18 - 0x10)) {
            lVar5 = 0;
            do {
              uVar3 = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x20 + 8);
              pBVar13 = op + lVar5 + 0x20;
              *(undefined8 *)pBVar13 = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x20);
              *(undefined8 *)(pBVar13 + 8) = uVar3;
              uVar3 = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x30 + 8);
              *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + lVar5 + 0x30)
              ;
              *(undefined8 *)(pBVar13 + 0x18) = uVar3;
              lVar5 = lVar5 + 0x20;
            } while (pBVar13 + 0x20 < pBVar10);
          }
        }
        pBVar13 = pBVar10 + -uVar20;
        local_f8 = pBVar19;
        if ((ulong)((long)pBVar10 - (long)local_58) < uVar20) {
          if ((ulong)((long)pBVar10 - (long)local_60) < uVar20) {
            uVar12 = 0xffffffffffffffec;
          }
          else {
            lVar5 = (long)(pBVar10 + -uVar20) - (long)local_58;
            pBVar19 = local_68 + lVar5;
            if (local_68 < pBVar19 + local_110) {
              memmove(pBVar10,pBVar19,-lVar5);
              pBVar10 = pBVar10 + -lVar5;
              local_110 = local_110 + lVar5;
              pBVar13 = pBVar11;
              goto LAB_01d9bf38;
            }
            memmove(pBVar10,pBVar19,local_110);
          }
        }
        else {
LAB_01d9bf38:
          if (uVar20 < 0x10) {
            if (uVar20 < 8) {
              iVar15 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                ::dec64table + uVar20 * 4);
              *pBVar10 = *pBVar13;
              pBVar10[1] = pBVar13[1];
              pBVar10[2] = pBVar13[2];
              pBVar10[3] = pBVar13[3];
              pBVar11 = pBVar13 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec32table + uVar20 * 4);
              pBVar13 = pBVar13 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4) - (long)iVar15);
              *(undefined4 *)(pBVar10 + 4) = *(undefined4 *)pBVar11;
            }
            else {
              *(undefined8 *)pBVar10 = *(undefined8 *)pBVar13;
            }
            if (8 < local_110) {
              pBVar19 = pBVar13 + 8;
              pBVar11 = pBVar10 + 8;
              if ((long)pBVar11 - (long)pBVar19 < 0x10) {
                do {
                  *(undefined8 *)pBVar11 = *(undefined8 *)pBVar19;
                  pBVar11 = pBVar11 + 8;
                  pBVar19 = pBVar19 + 8;
                } while (pBVar11 < pBVar10 + local_110);
              }
              else {
                uVar3 = *(undefined8 *)(pBVar13 + 0x10);
                *(undefined8 *)pBVar11 = *(undefined8 *)pBVar19;
                *(undefined8 *)(pBVar10 + 0x10) = uVar3;
                if (0x18 < (long)local_110) {
                  lVar5 = 0;
                  do {
                    uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x18 + 8);
                    pBVar11 = pBVar10 + lVar5 + 0x18;
                    *(undefined8 *)pBVar11 = *(undefined8 *)(pBVar13 + lVar5 + 0x18);
                    *(undefined8 *)(pBVar11 + 8) = uVar3;
                    uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x28 + 8);
                    *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(pBVar13 + lVar5 + 0x28);
                    *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                    lVar5 = lVar5 + 0x20;
                  } while (pBVar11 + 0x20 < pBVar10 + local_110);
                }
              }
            }
          }
          else {
            uVar3 = *(undefined8 *)(pBVar13 + 8);
            *(undefined8 *)pBVar10 = *(undefined8 *)pBVar13;
            *(undefined8 *)(pBVar10 + 8) = uVar3;
            if (0x10 < (long)local_110) {
              lVar5 = 0x10;
              do {
                uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 8);
                pBVar11 = pBVar10 + lVar5;
                *(undefined8 *)pBVar11 = *(undefined8 *)(pBVar13 + lVar5);
                *(undefined8 *)(pBVar11 + 8) = uVar3;
                uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x10 + 8);
                *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(pBVar13 + lVar5 + 0x10);
                *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                lVar5 = lVar5 + 0x20;
              } while (pBVar11 + 0x20 < pBVar10 + local_110);
            }
          }
        }
      }
      else {
        sequence_01.matchLength = local_110;
        sequence_01.litLength = uVar18;
        sequence_01.offset = uVar20;
        local_50 = uVar18;
        sStack_48 = local_110;
        local_40 = uVar20;
        uVar12 = ZSTD_execSequenceEnd
                           (op,local_f0,sequence_01,&local_f8,dctx->litExtraBuffer + 0x10000,
                            local_58,local_60,local_68);
      }
      bVar21 = uVar12 < 0xffffffffffffff89;
      if (!bVar21) {
        local_108 = uVar12;
        uVar12 = 0;
      }
      op = op + uVar12;
      nbSeq = nbSeq - (uint)bVar21;
    }
LAB_01d9bfc4:
    if (bVar21) {
      iVar15 = nbSeq;
      if (0 < nbSeq) {
        local_38 = local_f0 + -0x20;
        do {
          pBVar11 = local_58;
          uVar20 = (ulong)local_a0.table[local_a0.state].baseValue;
          uVar17 = local_c0.table[local_c0.state].baseValue;
          uVar18 = (ulong)uVar17;
          bVar1 = local_c0.table[local_c0.state].nbAdditionalBits;
          bVar7 = local_a0.table[local_a0.state].nbAdditionalBits;
          bVar2 = local_b0.table[local_b0.state].nbAdditionalBits;
          bVar6 = (byte)local_e8.bitsConsumed;
          if (bVar2 < 2) {
            if (bVar2 != 0) {
              local_e8.bitsConsumed = local_e8.bitsConsumed + 1;
              lVar5 = (ulong)(local_b0.table[local_b0.state].baseValue + (uint)(uVar17 == 0)) -
                      ((long)(local_e8.bitContainer << (bVar6 & 0x3f)) >> 0x3f);
              if (lVar5 == 3) {
                local_90[0] = local_90[0] - 1;
              }
              else {
                local_90[0] = local_90[lVar5];
              }
              uVar12 = -(ulong)(local_90[0] == 0) | local_90[0];
              if (lVar5 != 1) goto LAB_01d9c0d0;
              goto LAB_01d9c0e0;
            }
            uVar12 = local_90[uVar17 == 0];
            puVar9 = local_90 + (uVar17 != 0);
          }
          else {
            local_e8.bitsConsumed = local_e8.bitsConsumed + bVar2;
            uVar12 = ((local_e8.bitContainer << (bVar6 & 0x3f)) >> (-bVar2 & 0x3f)) +
                     (ulong)local_b0.table[local_b0.state].baseValue;
LAB_01d9c0d0:
            local_90[2] = local_90[1];
LAB_01d9c0e0:
            puVar9 = local_90;
          }
          local_90[1] = *puVar9;
          local_90[0] = uVar12;
          if (bVar7 != 0) {
            bVar6 = (byte)local_e8.bitsConsumed;
            local_e8.bitsConsumed = local_e8.bitsConsumed + bVar7;
            uVar20 = uVar20 + ((local_e8.bitContainer << (bVar6 & 0x3f)) >> (-bVar7 & 0x3f));
          }
          if (0x1e < (byte)(bVar7 + bVar1 + bVar2)) {
            if (local_e8.bitsConsumed < 0x41) {
              if (local_e8.ptr < local_e8.limitPtr) {
                if (local_e8.ptr == local_e8.start) goto LAB_01d9c15a;
                uVar14 = (ulong)(uint)((int)local_e8.ptr - (int)local_e8.start);
                if (local_e8.start <=
                    (ulong *)((long)local_e8.ptr - (ulong)(local_e8.bitsConsumed >> 3))) {
                  uVar14 = (ulong)(local_e8.bitsConsumed >> 3);
                }
                uVar17 = local_e8.bitsConsumed + (int)uVar14 * -8;
              }
              else {
                uVar14 = (ulong)(local_e8.bitsConsumed >> 3);
                uVar17 = local_e8.bitsConsumed & 7;
              }
              local_e8.ptr = (char *)((long)local_e8.ptr - uVar14);
              local_e8.bitsConsumed = uVar17;
              local_e8.bitContainer = *(BitContainerType *)local_e8.ptr;
            }
            else {
              local_e8.ptr = "";
            }
          }
LAB_01d9c15a:
          if (bVar1 != 0) {
            bVar7 = (byte)local_e8.bitsConsumed;
            local_e8.bitsConsumed = local_e8.bitsConsumed + bVar1;
            uVar18 = uVar18 + ((local_e8.bitContainer << (bVar7 & 0x3f)) >> (-bVar1 & 0x3f));
          }
          if (nbSeq != 1) {
            iVar15 = local_c0.table[local_c0.state].nbBits + local_e8.bitsConsumed;
            iVar16 = iVar15 + (uint)local_a0.table[local_a0.state].nbBits;
            local_c0.state =
                 (~(-1L << (local_c0.table[local_c0.state].nbBits & 0x3f)) &
                 local_e8.bitContainer >> (-(char)iVar15 & 0x3fU)) +
                 (ulong)local_c0.table[local_c0.state].nextState;
            uVar17 = iVar16 + (uint)local_b0.table[local_b0.state].nbBits;
            local_a0.state =
                 (~(-1L << (local_a0.table[local_a0.state].nbBits & 0x3f)) &
                 local_e8.bitContainer >> (-(char)iVar16 & 0x3fU)) +
                 (ulong)local_a0.table[local_a0.state].nextState;
            local_b0.state =
                 (~(-1L << (local_b0.table[local_b0.state].nbBits & 0x3f)) &
                 local_e8.bitContainer >> (-(char)uVar17 & 0x3fU)) +
                 (ulong)local_b0.table[local_b0.state].nextState;
            local_e8.bitsConsumed = uVar17;
            if (uVar17 < 0x41) {
              if (local_e8.ptr < local_e8.limitPtr) {
                if (local_e8.ptr == local_e8.start) goto LAB_01d9c282;
                uVar8 = (int)local_e8.ptr - (int)local_e8.start;
                if (local_e8.start <= (ulong *)((long)local_e8.ptr - (ulong)(uVar17 >> 3))) {
                  uVar8 = uVar17 >> 3;
                }
                local_e8.bitsConsumed = uVar17 + uVar8 * -8;
              }
              else {
                uVar8 = uVar17 >> 3;
                local_e8.bitsConsumed = uVar17 & 7;
              }
              local_e8.ptr = (char *)((long)local_e8.ptr - (ulong)uVar8);
              local_e8.bitContainer = *(BitContainerType *)local_e8.ptr;
            }
            else {
              local_e8.ptr = "";
            }
          }
LAB_01d9c282:
          pBVar10 = local_f8 + uVar18;
          if ((local_70 < pBVar10) || (uVar14 = uVar18 + uVar20, local_38 < op + uVar14)) {
            sequence_00.matchLength = uVar20;
            sequence_00.litLength = uVar18;
            sequence_00.offset = uVar12;
            local_50 = uVar18;
            sStack_48 = uVar20;
            local_40 = uVar12;
            uVar14 = ZSTD_execSequenceEnd
                               (op,local_f0,sequence_00,&local_f8,local_70,local_58,local_60,
                                local_68);
          }
          else {
            pBVar19 = op + uVar18;
            uVar3 = *(undefined8 *)(local_f8 + 8);
            *(undefined8 *)op = *(undefined8 *)local_f8;
            *(undefined8 *)(op + 8) = uVar3;
            if (0x10 < uVar18) {
              uVar3 = *(undefined8 *)(local_f8 + 0x18);
              *(undefined8 *)(op + 0x10) = *(undefined8 *)(local_f8 + 0x10);
              *(undefined8 *)(op + 0x18) = uVar3;
              if (0x10 < (long)(uVar18 - 0x10)) {
                lVar5 = 0;
                do {
                  uVar3 = *(undefined8 *)(local_f8 + lVar5 + 0x20 + 8);
                  pBVar13 = op + lVar5 + 0x20;
                  *(undefined8 *)pBVar13 = *(undefined8 *)(local_f8 + lVar5 + 0x20);
                  *(undefined8 *)(pBVar13 + 8) = uVar3;
                  uVar3 = *(undefined8 *)(local_f8 + lVar5 + 0x30 + 8);
                  *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(local_f8 + lVar5 + 0x30);
                  *(undefined8 *)(pBVar13 + 0x18) = uVar3;
                  lVar5 = lVar5 + 0x20;
                } while (pBVar13 + 0x20 < pBVar19);
              }
            }
            pBVar13 = pBVar19 + -uVar12;
            local_f8 = pBVar10;
            if ((ulong)((long)pBVar19 - (long)local_58) < uVar12) {
              if ((ulong)((long)pBVar19 - (long)local_60) < uVar12) {
                uVar14 = 0xffffffffffffffec;
              }
              else {
                lVar5 = (long)(pBVar19 + -uVar12) - (long)local_58;
                pBVar10 = local_68 + lVar5;
                if (local_68 < pBVar10 + uVar20) {
                  memmove(pBVar19,pBVar10,-lVar5);
                  pBVar19 = pBVar19 + -lVar5;
                  uVar20 = uVar20 + lVar5;
                  pBVar13 = pBVar11;
                  goto LAB_01d9c337;
                }
                memmove(pBVar19,pBVar10,uVar20);
              }
            }
            else {
LAB_01d9c337:
              if (uVar12 < 0x10) {
                if (uVar12 < 8) {
                  iVar15 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                    ::dec64table + uVar12 * 4);
                  *pBVar19 = *pBVar13;
                  pBVar19[1] = pBVar13[1];
                  pBVar19[2] = pBVar13[2];
                  pBVar19[3] = pBVar13[3];
                  pBVar11 = pBVar13 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                ::dec32table + uVar12 * 4);
                  pBVar13 = pBVar13 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar12 * 4) - (long)iVar15);
                  *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)pBVar11;
                }
                else {
                  *(undefined8 *)pBVar19 = *(undefined8 *)pBVar13;
                }
                if (8 < uVar20) {
                  pBVar11 = pBVar13 + 8;
                  pBVar10 = pBVar19 + 8;
                  if ((long)pBVar10 - (long)pBVar11 < 0x10) {
                    do {
                      *(undefined8 *)pBVar10 = *(undefined8 *)pBVar11;
                      pBVar10 = pBVar10 + 8;
                      pBVar11 = pBVar11 + 8;
                    } while (pBVar10 < pBVar19 + uVar20);
                  }
                  else {
                    uVar3 = *(undefined8 *)(pBVar13 + 0x10);
                    *(undefined8 *)pBVar10 = *(undefined8 *)pBVar11;
                    *(undefined8 *)(pBVar19 + 0x10) = uVar3;
                    if (0x18 < (long)uVar20) {
                      lVar5 = 0;
                      do {
                        uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x18 + 8);
                        pBVar11 = pBVar19 + lVar5 + 0x18;
                        *(undefined8 *)pBVar11 = *(undefined8 *)(pBVar13 + lVar5 + 0x18);
                        *(undefined8 *)(pBVar11 + 8) = uVar3;
                        uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x28 + 8);
                        *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(pBVar13 + lVar5 + 0x28);
                        *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                        lVar5 = lVar5 + 0x20;
                      } while (pBVar11 + 0x20 < pBVar19 + uVar20);
                    }
                  }
                }
              }
              else {
                uVar3 = *(undefined8 *)(pBVar13 + 8);
                *(undefined8 *)pBVar19 = *(undefined8 *)pBVar13;
                *(undefined8 *)(pBVar19 + 8) = uVar3;
                if (0x10 < (long)uVar20) {
                  lVar5 = 0x10;
                  do {
                    uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 8);
                    pBVar11 = pBVar19 + lVar5;
                    *(undefined8 *)pBVar11 = *(undefined8 *)(pBVar13 + lVar5);
                    *(undefined8 *)(pBVar11 + 8) = uVar3;
                    uVar3 = *(undefined8 *)(pBVar13 + lVar5 + 0x10 + 8);
                    *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(pBVar13 + lVar5 + 0x10);
                    *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                    lVar5 = lVar5 + 0x20;
                  } while (pBVar11 + 0x20 < pBVar19 + uVar20);
                }
              }
            }
          }
          iVar15 = 0;
          uVar18 = 0;
          if (uVar14 < 0xffffffffffffff89) {
            uVar18 = uVar14;
          }
          op = op + uVar18;
          if (0xffffffffffffff88 < uVar14) goto LAB_01d9c6c3;
          nbSeq = nbSeq + -1;
        } while (nbSeq != 0);
      }
      if (iVar15 == 0) {
        bVar21 = false;
        pBVar11 = local_f0;
        if ((local_e8.ptr == local_e8.start) && (local_e8.bitsConsumed == 0x40)) {
          lVar5 = 0;
          do {
            (dctx->entropy).rep[lVar5] = (U32)local_90[lVar5];
            lVar5 = lVar5 + 1;
            bVar21 = true;
          } while (lVar5 != 3);
        }
        else {
          local_108 = 0xffffffffffffffec;
        }
      }
      else {
        uVar14 = 0xffffffffffffffec;
LAB_01d9c6c3:
        bVar21 = false;
        pBVar11 = local_f0;
        local_108 = uVar14;
      }
    }
    else {
      bVar21 = false;
      pBVar11 = local_f0;
    }
  }
  unaff_RBP = local_108;
  if (!bVar21) {
    return local_108;
  }
LAB_01d9c6d0:
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar18 = (long)local_70 - (long)local_f8;
    uVar20 = (long)pBVar11 - (long)op;
    if (uVar20 < uVar18) {
      unaff_RBP = 0xffffffffffffffba;
    }
    else {
      if (op == (BYTE *)0x0) {
        op = (BYTE *)0x0;
      }
      else {
        memmove(op,local_f8,uVar18);
        op = op + uVar18;
      }
      local_f8 = dctx->litExtraBuffer;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      local_70 = dctx->litExtraBuffer + 0x10000;
    }
    if (uVar20 < uVar18) {
      return unaff_RBP;
    }
  }
  uVar18 = (long)local_70 - (long)local_f8;
  uVar20 = (long)pBVar11 - (long)op;
  if (uVar20 < uVar18) {
    unaff_RBP = 0xffffffffffffffba;
  }
  else if (op == (BYTE *)0x0) {
    op = (BYTE *)0x0;
  }
  else {
    switchD_015ff80e::default(op,local_f8,uVar18);
    op = op + uVar18;
  }
  if (uVar18 <= uVar20) {
    unaff_RBP = (long)op - (long)dst;
  }
  return unaff_RBP;
}

Assistant:

static size_t
ZSTD_decompressSequencesSplitLitBuffer(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                                 const void* seqStart, size_t seqSize, int nbSeq,
                                 const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesSplitLitBuffer");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesSplitLitBuffer_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
    return ZSTD_decompressSequencesSplitLitBuffer_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}